

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blf_cbc_encrypt(blf_ctx *c,uint8_t *iv,uint8_t *data,uint32_t len)

{
  uint local_34;
  uint local_30;
  uint32_t j;
  uint32_t i;
  uint32_t r;
  uint32_t l;
  uint32_t len_local;
  uint8_t *data_local;
  uint8_t *iv_local;
  blf_ctx *c_local;
  
  r = len;
  _l = data;
  data_local = iv;
  iv_local = (uint8_t *)c;
  for (local_30 = 0; local_30 < r; local_30 = local_30 + 8) {
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      _l[local_34] = _l[local_34] ^ data_local[local_34];
    }
    i = (uint)*_l << 0x18 | (uint)_l[1] << 0x10 | (uint)_l[2] << 8 | (uint)_l[3];
    j = (uint)_l[4] << 0x18 | (uint)_l[5] << 0x10 | (uint)_l[6] << 8 | (uint)_l[7];
    Blowfish_encipher((blf_ctx *)iv_local,&i,&j);
    *_l = (byte)(i >> 0x18);
    _l[1] = (byte)(i >> 0x10);
    _l[2] = (byte)(i >> 8);
    _l[3] = (byte)i;
    _l[4] = (byte)(j >> 0x18);
    _l[5] = (byte)(j >> 0x10);
    _l[6] = (byte)(j >> 8);
    _l[7] = (byte)j;
    data_local = _l;
    _l = _l + 8;
  }
  return;
}

Assistant:

void
blf_cbc_encrypt(blf_ctx *c, uint8_t *iv, uint8_t *data, uint32_t len)
{
    uint32_t l, r;
    uint32_t i, j;

    for(i = 0; i < len; i += 8) {
        for(j = 0; j < 8; j++)
            data[j] ^= iv[j];
        l = data[0] << 24 | data[1] << 16 | data[2] << 8 | data[3];
        r = data[4] << 24 | data[5] << 16 | data[6] << 8 | data[7];
        Blowfish_encipher(c, &l, &r);
        data[0] = l >> 24 & 0xff;
        data[1] = l >> 16 & 0xff;
        data[2] = l >> 8 & 0xff;
        data[3] = l & 0xff;
        data[4] = r >> 24 & 0xff;
        data[5] = r >> 16 & 0xff;
        data[6] = r >> 8 & 0xff;
        data[7] = r & 0xff;
        iv = data;
        data += 8;
    }
}